

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

bool __thiscall FakeCheckCheckCompletion::operator()(FakeCheckCheckCompletion *this)

{
  long in_FS_OFFSET;
  
  LOCK();
  n_calls.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)((long)n_calls.super___atomic_base<unsigned_long>._M_i + 1);
  UNLOCK();
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool operator()()
    {
        n_calls.fetch_add(1, std::memory_order_relaxed);
        return true;
    }